

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid_36_c.c
# Opt level: O2

char * hy36encode(uint width,int value,char *result)

{
  uint width_00;
  int value_00;
  char *digits;
  
  if (width == 5) {
    if (value < -9999) goto LAB_00122aaf;
    if (value < 100000) {
      width_00 = 5;
      goto LAB_00122a3a;
    }
    if ((uint)value < 0x29be0a0) {
      value_00 = value + 0xfec360;
      goto LAB_00122a73;
    }
    if (0x5363a9f < (uint)value) goto LAB_00122aaf;
    value_00 = value + -0x19b96a0;
  }
  else {
    if (width != 4) {
      fill_with_stars(width,result);
      return "unsupported width.";
    }
    if (value < -999) {
LAB_00122aaf:
      fill_with_stars(width,result);
      return "value out of range.";
    }
    if (value < 10000) {
      width_00 = 4;
LAB_00122a3a:
      encode_pure("0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ",10,width_00,value,result);
      return (char *)0x0;
    }
    if ((uint)value < 0x12a990) {
      value_00 = value + 0x6f770;
LAB_00122a73:
      digits = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
      goto LAB_00122aa1;
    }
    if (0x252c0f < (uint)value) goto LAB_00122aaf;
    value_00 = value + -0xb8b10;
  }
  digits = "0123456789abcdefghijklmnopqrstuvwxyz";
LAB_00122aa1:
  encode_pure(digits,0x24,0,value_00,result);
  return (char *)0x0;
}

Assistant:

const char*
hy36encode(unsigned width, int value, char* result)
{
  int i = value;
  if (width == 4U) {
    if (i >= -999) {
      if (i < 10000) {
        encode_pure(digits_upper(), 10U, 4U, i, result);
        return 0;
      }
      i -= 10000;
      if (i < 1213056 /* 26*36**3 */) {
        i += 466560 /* 10*36**3 */;
        encode_pure(digits_upper(), 36U, 0U, i, result);
        return 0;
      }
      i -= 1213056;
      if (i < 1213056) {
        i += 466560;
        encode_pure(digits_lower(), 36U, 0U, i, result);
        return 0;
      }
    }
  }
  else if (width == 5U) {
    if (i >= -9999) {
      if (i < 100000) {
        encode_pure(digits_upper(), 10U, 5U, i, result);
        return 0;
      }
      i -= 100000;
      if (i < 43670016 /* 26*36**4 */) {
        i += 16796160 /* 10*36**4 */;
        encode_pure(digits_upper(), 36U, 0U, i, result);
        return 0;
      }
      i -= 43670016;
      if (i < 43670016) {
        i += 16796160;
        encode_pure(digits_lower(), 36U, 0U, i, result);
        return 0;
      }
    }
  }
  else {
    fill_with_stars(width, result);
    return unsupported_width();
  }
  fill_with_stars(width, result);
  return value_out_of_range();
}